

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void do_actual_learning_ldf<false>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  cb_class **ppcVar3;
  example *peVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  size_t sVar8;
  action_score *paVar9;
  pointer pvVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  label_t lVar15;
  label_t lVar16;
  float *pfVar17;
  float *pfVar18;
  cb_class *pcVar19;
  wclass *pwVar20;
  multi_learner *pmVar21;
  cbify *this_01;
  int iVar22;
  float fVar23;
  uint uVar24;
  pointer ppeVar25;
  vw_exception *pvVar26;
  pointer pvVar27;
  ulong uVar28;
  cbify *pcVar29;
  long lVar30;
  bool bVar31;
  float fVar32;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_224;
  cb_class local_220;
  multi_learner *local_210;
  cbify *local_208;
  multi_ex *local_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  uVar28 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_210 = base;
  if ((ulong)((long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar28) {
    std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::resize(&data->cs_costs,uVar28);
  }
  this = &data->cb_costs;
  uVar28 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if ((ulong)((long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar28) {
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize(this,uVar28)
    ;
  }
  this_00 = &data->cb_as;
  uVar28 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_208 = data;
  if ((ulong)((long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar28) {
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::resize(this_00,uVar28);
  }
  ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar25) {
    lVar30 = 0;
    uVar28 = 0;
    local_200 = ec_seq;
    do {
      peVar4 = ppeVar25[uVar28];
      pvVar5 = (data->cs_costs).
               super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (peVar4->l).multi;
      lVar16 = (label_t)(peVar4->l).cs.costs._end;
      sVar8 = (peVar4->l).cs.costs.erase_count;
      puVar2 = (undefined8 *)((long)&pvVar5->end_array + lVar30);
      *puVar2 = (peVar4->l).cs.costs.end_array;
      puVar2[1] = sVar8;
      plVar1 = (label_t *)((long)&pvVar5->_begin + lVar30);
      *plVar1 = lVar15;
      plVar1[1] = lVar16;
      v_array<CB::cb_class>::clear
                ((v_array<CB::cb_class> *)
                 ((long)&((this->
                          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar30));
      v_array<ACTION_SCORE::action_score>::clear
                ((v_array<ACTION_SCORE::action_score> *)
                 ((long)&((this_00->
                          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar30));
      pvVar6 = (this->
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      plVar1 = (label_t *)((long)&pvVar6->_begin + lVar30);
      lVar15 = *plVar1;
      lVar16 = plVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar6->end_array + lVar30);
      sVar8 = puVar2[1];
      (peVar4->l).cs.costs.end_array = (wclass *)*puVar2;
      (peVar4->l).cs.costs.erase_count = sVar8;
      (peVar4->l).multi = lVar15;
      (peVar4->l).cs.costs._end = (wclass *)lVar16;
      pvVar7 = (this_00->
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)&pvVar7->_begin + lVar30);
      pfVar17 = (float *)*puVar2;
      pfVar18 = (float *)puVar2[1];
      puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar30);
      sVar8 = puVar2[1];
      (peVar4->pred).scalars.end_array = (float *)*puVar2;
      (peVar4->pred).scalars.erase_count = sVar8;
      (peVar4->pred).scalars._begin = pfVar17;
      (peVar4->pred).scalars._end = pfVar18;
      uVar28 = uVar28 + 1;
      ppeVar25 = (local_200->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar30 = lVar30 + 0x20;
      ec_seq = local_200;
    } while (uVar28 < (ulong)((long)(local_200->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar25 >> 3)
            );
  }
  pmVar21 = local_210;
  (**(code **)(local_210 + 0x30))
            (*(undefined8 *)(local_210 + 0x18),*(undefined8 *)(local_210 + 0x20),ec_seq);
  this_01 = local_208;
  peVar4 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar8 = local_208->example_counter;
  local_208->example_counter = sVar8 + 1;
  local_1b0 = (peVar4->pred).scalars._begin;
  local_220._8_8_ = *(undefined8 *)((long)&peVar4->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_220._0_8_ =
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar22 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar8 + local_208->app_seed,&local_1b8,&local_220,&local_224);
  if (iVar22 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar26 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar26,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x117,&local_1d8);
    __cxa_throw(pvVar26,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar9 = (peVar4->pred).a_s._begin;
  fVar23 = (float)(paVar9[local_224].action + 1);
  local_220.action = (uint32_t)fVar23;
  local_220.probability = paVar9[local_224].score;
  if (fVar23 == 0.0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar26 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar26,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x11e,&local_1f8);
    __cxa_throw(pvVar26,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pvVar5 = (this_01->cs_costs).
           super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar10 = (this_01->cs_costs).
            super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 == pvVar10) {
    fVar32 = 0.0;
  }
  else {
    fVar32 = 0.0;
    do {
      pvVar27 = pvVar5 + 1;
      if ((float)pvVar5->_begin->class_index == fVar23) {
        fVar32 = pvVar5->_begin->x;
        break;
      }
      pvVar5 = pvVar27;
    } while (pvVar27 != pvVar10);
  }
  local_220.cost = (this_01->loss1 - this_01->loss0) * fVar32 + this_01->loss0;
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)this_01);
  v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)this_01,&local_220);
  uVar24 = local_220.action - 1;
  peVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar24];
  pvVar6 = (this_01->cb_costs).
           super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar15 = (peVar4->l).multi;
  pcVar19 = (cb_class *)(peVar4->l).cs.costs._end;
  sVar8 = (peVar4->l).cs.costs.erase_count;
  ppcVar3 = &pvVar6[uVar24].end_array;
  *ppcVar3 = (cb_class *)(peVar4->l).cs.costs.end_array;
  ppcVar3[1] = (cb_class *)sVar8;
  pvVar6 = pvVar6 + uVar24;
  pvVar6->_begin = (cb_class *)lVar15;
  pvVar6->_end = pcVar19;
  peVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar24];
  fVar23 = *(float *)&(this_01->cb_label).costs._begin;
  fVar32 = *(float *)((long)&(this_01->cb_label).costs._begin + 4);
  fVar11 = *(float *)&(this_01->cb_label).costs._end;
  uVar12 = *(undefined4 *)((long)&(this_01->cb_label).costs._end + 4);
  uVar13 = *(undefined4 *)((long)&(this_01->cb_label).costs.end_array + 4);
  sVar8 = (this_01->cb_label).costs.erase_count;
  uVar14 = *(undefined4 *)((long)&(this_01->cb_label).costs.erase_count + 4);
  *(undefined4 *)((long)&peVar4->l + 0x10) = *(undefined4 *)&(this_01->cb_label).costs.end_array;
  *(undefined4 *)((long)&peVar4->l + 0x14) = uVar13;
  *(int *)((long)&peVar4->l + 0x18) = (int)sVar8;
  *(undefined4 *)((long)&peVar4->l + 0x1c) = uVar14;
  (peVar4->l).simple.label = fVar23;
  (peVar4->l).simple.weight = fVar32;
  (peVar4->l).simple.initial = fVar11;
  *(undefined4 *)((long)&peVar4->l + 0xc) = uVar12;
  (**(code **)(pmVar21 + 0x28))
            (*(undefined8 *)(pmVar21 + 0x18),*(undefined8 *)(pmVar21 + 0x20),ec_seq);
  ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar25) {
    lVar30 = 0;
    uVar28 = 0;
    do {
      peVar4 = ppeVar25[uVar28];
      pvVar7 = (this_01->cb_as).
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar17 = (peVar4->pred).scalars._begin;
      pfVar18 = (peVar4->pred).scalars._end;
      sVar8 = (peVar4->pred).scalars.erase_count;
      puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar30);
      *puVar2 = (peVar4->pred).scalars.end_array;
      puVar2[1] = sVar8;
      puVar2 = (undefined8 *)((long)&pvVar7->_begin + lVar30);
      *puVar2 = pfVar17;
      puVar2[1] = pfVar18;
      bVar31 = local_220.action - 1 == uVar28;
      pcVar29 = (cbify *)((long)&((this_01->cb_costs).
                                  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_begin + lVar30);
      if (bVar31) {
        pcVar29 = this_01;
      }
      fVar23 = 0.0;
      if (bVar31) {
        fVar23 = (float)local_220.action;
      }
      lVar15 = (peVar4->l).multi;
      pcVar19 = (cb_class *)(peVar4->l).cs.costs._end;
      sVar8 = (peVar4->l).cs.costs.erase_count;
      (pcVar29->cb_label).costs.end_array = (cb_class *)(peVar4->l).cs.costs.end_array;
      (pcVar29->cb_label).costs.erase_count = sVar8;
      (pcVar29->cb_label).costs._begin = (cb_class *)lVar15;
      (pcVar29->cb_label).costs._end = pcVar19;
      pvVar5 = (this_01->cs_costs).
               super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar1 = (label_t *)((long)&pvVar5->_begin + lVar30);
      lVar15 = plVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar5->end_array + lVar30);
      pwVar20 = (wclass *)*puVar2;
      sVar8 = puVar2[1];
      (peVar4->l).multi = *plVar1;
      (peVar4->l).cs.costs._end = (wclass *)lVar15;
      (peVar4->l).cs.costs.end_array = pwVar20;
      (peVar4->l).cs.costs.erase_count = sVar8;
      (peVar4->pred).scalar = fVar23;
      uVar28 = uVar28 + 1;
      ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar30 = lVar30 + 0x20;
    } while (uVar28 < (ulong)((long)(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar25 >> 3)
            );
  }
  return;
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  // change label and pred data for cb
  if (data.cs_costs.size() < ec_seq.size())
    data.cs_costs.resize(ec_seq.size());
  if (data.cb_costs.size() < ec_seq.size())
    data.cb_costs.resize(ec_seq.size());
  if (data.cb_as.size() < ec_seq.size())
    data.cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cs_costs[i] = ec.l.cs.costs;
    data.cb_costs[i].clear();
    data.cb_as[i].clear();
    ec.l.cb.costs = data.cb_costs[i];
    ec.pred.a_s = data.cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, data.cs_costs, cl.action);

  // add cb label to chosen action
  data.cb_label.costs.clear();
  data.cb_label.costs.push_back(cl);
  data.cb_costs[cl.action-1] = ec_seq[cl.action-1]->l.cb.costs;
  ec_seq[cl.action - 1]->l.cb = data.cb_label;

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cb_as[i]=ec.pred.a_s;//store action_score vector for later reuse.
    if (i == cl.action -1 )
      data.cb_label = ec.l.cb;
    else
      data.cb_costs[i] = ec.l.cb.costs;
    ec.l.cs.costs = data.cs_costs[i];
    if (i == cl.action - 1)
      ec.pred.multiclass = cl.action;
    else
      ec.pred.multiclass = 0;
  }
}